

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym3438.c
# Opt level: O0

void NOPN2_WriteBuffered(ym3438_t *chip,UINT8 port,UINT8 data)

{
  Bit64u BVar1;
  Bit64u BVar2;
  long local_38;
  Bit64u skip;
  Bit32s buffer [2];
  Bit64u time2;
  Bit64u time1;
  UINT8 data_local;
  UINT8 port_local;
  ym3438_t *chip_local;
  
  if ((chip->writebuf[chip->writebuf_last].port & 4) != 0) {
    NOPN2_Write(chip,chip->writebuf[chip->writebuf_last].port & 3,
                chip->writebuf[chip->writebuf_last].data);
    chip->writebuf_cur = chip->writebuf_last + 1 & 0x7ff;
    BVar1 = chip->writebuf[chip->writebuf_last].time;
    BVar2 = chip->writebuf_samplecnt;
    chip->writebuf_samplecnt = chip->writebuf[chip->writebuf_last].time;
    local_38 = BVar1 - BVar2;
    while (local_38 != 0) {
      NOPN2_Clock(chip,(Bit32s *)&skip);
      local_38 = local_38 + -1;
    }
  }
  chip->writebuf[chip->writebuf_last].port = port & 3 | 4;
  chip->writebuf[chip->writebuf_last].data = data;
  time2 = chip->writebuf_lasttime + 0xf;
  if (time2 < chip->writebuf_samplecnt) {
    time2 = chip->writebuf_samplecnt;
  }
  chip->writebuf[chip->writebuf_last].time = time2;
  chip->writebuf_lasttime = time2;
  chip->writebuf_last = chip->writebuf_last + 1 & 0x7ff;
  return;
}

Assistant:

void NOPN2_WriteBuffered(ym3438_t *chip, UINT8 port, UINT8 data)
{
    Bit64u time1, time2;
    Bit32s buffer[2];
    Bit64u skip;

    if (chip->writebuf[chip->writebuf_last].port & 0x04)
    {
        NOPN2_Write(chip, chip->writebuf[chip->writebuf_last].port & 0X03,
                   chip->writebuf[chip->writebuf_last].data);

        chip->writebuf_cur = (chip->writebuf_last + 1) % NOPN_WRITEBUF_SIZE;
        skip = chip->writebuf[chip->writebuf_last].time - chip->writebuf_samplecnt;
        chip->writebuf_samplecnt = chip->writebuf[chip->writebuf_last].time;
        while (skip--)
        {
            NOPN2_Clock(chip, buffer);
        }
    }

    chip->writebuf[chip->writebuf_last].port = (port & 0x03) | 0x04;
    chip->writebuf[chip->writebuf_last].data = data;
    time1 = chip->writebuf_lasttime + NOPN_WRITEBUF_DELAY;
    time2 = chip->writebuf_samplecnt;

    if (time1 < time2)
    {
        time1 = time2;
    }

    chip->writebuf[chip->writebuf_last].time = time1;
    chip->writebuf_lasttime = time1;
    chip->writebuf_last = (chip->writebuf_last + 1) % NOPN_WRITEBUF_SIZE;
}